

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O0

int luaB_collectgarbage(lua_State *L)

{
  int iVar1;
  int b_00;
  lua_Integer lVar2;
  int b;
  int res;
  int ex;
  int o;
  lua_State *L_local;
  
  iVar1 = luaL_checkoption(L,1,"collect",luaB_collectgarbage::opts);
  lVar2 = luaL_optinteger(L,2,0);
  b_00 = lua_gc(L,luaB_collectgarbage::optsnum[iVar1],(int)lVar2);
  if (luaB_collectgarbage::optsnum[iVar1] == 3) {
    iVar1 = lua_gc(L,4,0);
    lua_pushnumber(L,(double)b_00 + (double)iVar1 / 1024.0);
  }
  else if (luaB_collectgarbage::optsnum[iVar1] == 5) {
    lua_pushboolean(L,b_00);
  }
  else {
    lua_pushnumber(L,(double)b_00);
  }
  return 1;
}

Assistant:

static int luaB_collectgarbage (lua_State *L) {
  static const char *const opts[] = {"stop", "restart", "collect",
    "count", "step", "setpause", "setstepmul", NULL};
  static const int optsnum[] = {LUA_GCSTOP, LUA_GCRESTART, LUA_GCCOLLECT,
    LUA_GCCOUNT, LUA_GCSTEP, LUA_GCSETPAUSE, LUA_GCSETSTEPMUL};
  int o = luaL_checkoption(L, 1, "collect", opts);
  int ex = luaL_optint(L, 2, 0);
  int res = lua_gc(L, optsnum[o], ex);
  switch (optsnum[o]) {
    case LUA_GCCOUNT: {
      int b = lua_gc(L, LUA_GCCOUNTB, 0);
      lua_pushnumber(L, res + ((lua_Number)b/1024));
      return 1;
    }
    case LUA_GCSTEP: {
      lua_pushboolean(L, res);
      return 1;
    }
    default: {
      lua_pushnumber(L, res);
      return 1;
    }
  }
}